

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

val eval(c2m_ctx_t c2m_ctx,node_t_conflict tree)

{
  node_t_conflict pnVar1;
  uint uVar2;
  ulong uVar3;
  node_t pnVar4;
  char *pcVar5;
  anon_union_8_2_027a474d_for_u aVar6;
  bool bVar7;
  val vVar8;
  pos_t pVar9;
  val local_48;
  val local_38;
  
  switch(tree->code) {
  case N_IGNORE:
    pVar9 = get_node_pos(c2m_ctx,tree);
    uVar3 = 0;
    error(c2m_ctx,0x1c3235,pVar9.fname,pVar9._8_8_);
    aVar6.i_val = 0;
    break;
  case N_I:
  case N_L:
  case N_LL:
    aVar6 = (anon_union_8_2_027a474d_for_u)(tree->u).s.s;
    goto LAB_0019578e;
  case N_U:
  case N_UL:
  case N_ULL:
  case N_CH16:
  case N_CH32:
    aVar6 = (anon_union_8_2_027a474d_for_u)(tree->u).s.s;
    uVar3 = 1;
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0xddc,"struct val eval(c2m_ctx_t, node_t)");
  case N_CH:
    aVar6 = (anon_union_8_2_027a474d_for_u)(long)(tree->u).ch;
    goto LAB_0019578e;
  case N_ANDAND:
  case N_OROR:
    vVar8 = eval(c2m_ctx,(tree->u).ops.head);
    local_48.u = vVar8.u;
    local_48.uns_p = vVar8.uns_p;
    bVar7 = local_48.u.i_val != 0;
    if (tree->code == N_ANDAND) {
      if (local_48.u.i_val == 0) {
        bVar7 = false;
      }
      else {
LAB_00195765:
        pnVar4 = (tree->u).ops.head;
        if (pnVar4 != (node_t)0x0) {
          pnVar4 = (pnVar4->op_link).next;
        }
        vVar8 = eval(c2m_ctx,pnVar4);
        bVar7 = vVar8.u.i_val != 0;
      }
    }
    else if (local_48.u.i_val == 0) goto LAB_00195765;
    aVar6.i_val._1_7_ = 0;
    aVar6.i_val._0_1_ = bVar7;
    goto LAB_0019578e;
  case N_EQ:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
    bVar7 = local_48.u.i_val == local_38.u.i_val;
    goto LAB_0019555d;
  case N_NE:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
    uVar3 = (ulong)uVar2;
    aVar6.i_val._1_7_ = 0;
    aVar6.i_val._0_1_ = local_48.u.i_val != local_38.u.i_val;
    break;
  case N_LT:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
    uVar3 = (ulong)uVar2;
    if (uVar2 != 0) {
      aVar6.i_val._1_7_ = 0;
      aVar6.i_val._0_1_ = local_48.u.u_val < local_38.u.u_val;
      break;
    }
    aVar6.i_val._1_7_ = 0;
    aVar6.i_val._0_1_ = local_48.u.i_val < local_38.u.i_val;
    goto LAB_0019578e;
  case N_LE:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
    uVar3 = (ulong)uVar2;
    if (uVar2 != 0) {
      aVar6.i_val._1_7_ = 0;
      aVar6.i_val._0_1_ = local_48.u.u_val <= local_38.u.u_val;
      break;
    }
    aVar6.i_val._1_7_ = 0;
    aVar6.i_val._0_1_ = local_48.u.i_val <= local_38.u.i_val;
    goto LAB_0019578e;
  case N_GT:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
    uVar3 = (ulong)uVar2;
    if (uVar2 != 0) {
      aVar6.i_val._1_7_ = 0;
      aVar6.i_val._0_1_ = local_38.u.u_val < local_48.u.u_val;
      break;
    }
    aVar6.i_val._1_7_ = 0;
    aVar6.i_val._0_1_ = local_38.u.i_val < local_48.u.i_val;
    goto LAB_0019578e;
  case N_GE:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
    uVar3 = (ulong)uVar2;
    if (uVar2 != 0) {
      aVar6.i_val._1_7_ = 0;
      aVar6.i_val._0_1_ = local_38.u.u_val <= local_48.u.u_val;
      break;
    }
    aVar6.i_val._1_7_ = 0;
    aVar6.i_val._0_1_ = local_38.u.i_val <= local_48.u.i_val;
    goto LAB_0019578e;
  case N_BITWISE_NOT:
    vVar8 = eval(c2m_ctx,(tree->u).ops.head);
    uVar3 = (ulong)(uint)vVar8.uns_p;
    aVar6.u_val = ~vVar8.u.u_val;
    break;
  case N_NOT:
    vVar8 = eval(c2m_ctx,(tree->u).ops.head);
    uVar2 = vVar8.uns_p;
    bVar7 = vVar8.u.i_val == 0;
LAB_0019555d:
    uVar3 = (ulong)uVar2;
    aVar6.i_val._1_7_ = 0;
    aVar6.i_val._0_1_ = bVar7;
    break;
  case N_AND:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
    uVar3 = (ulong)uVar2;
    aVar6.u_val = local_38.u.u_val & local_48.u.u_val;
    break;
  case N_OR:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
    uVar3 = (ulong)uVar2;
    aVar6.u_val = local_38.u.u_val | local_48.u.u_val;
    break;
  case N_XOR:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
    uVar3 = (ulong)uVar2;
    aVar6.u_val = local_38.u.u_val ^ local_48.u.u_val;
    break;
  case N_LSH:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
    uVar3 = (ulong)uVar2;
    aVar6.u_val = local_48.u.u_val << (local_38.u.u_val & 0x3f);
    break;
  case N_RSH:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
    uVar3 = (ulong)uVar2;
    if (uVar2 != 0) {
      aVar6.u_val = local_48.u.u_val >> (local_38.u.u_val & 0x3f);
      break;
    }
    aVar6.i_val = local_48.u.i_val >> (local_38.u.u_val & 0x3f);
LAB_0019578e:
    uVar3 = 0;
    break;
  case N_ADD:
    pnVar1 = (tree->u).ops.head;
    if ((pnVar1 == (node_t_conflict)0x0) || ((pnVar1->op_link).next == (node_t)0x0)) {
      vVar8 = eval(c2m_ctx,pnVar1);
      aVar6 = vVar8.u;
      uVar3 = (ulong)(uint)vVar8.uns_p;
    }
    else {
      uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
      uVar3 = (ulong)uVar2;
      aVar6.i_val = local_38.u.i_val + local_48.u.i_val;
    }
    break;
  case N_SUB:
    pnVar1 = (tree->u).ops.head;
    if ((pnVar1 == (node_t_conflict)0x0) || ((pnVar1->op_link).next == (node_t)0x0)) {
      vVar8 = eval(c2m_ctx,pnVar1);
      uVar3 = (ulong)(uint)vVar8.uns_p;
      aVar6.i_val = -vVar8.u.i_val;
    }
    else {
      uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
      uVar3 = (ulong)uVar2;
      aVar6.i_val = local_48.u.i_val - local_38.u.i_val;
    }
    break;
  case N_MUL:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
    uVar3 = (ulong)uVar2;
    aVar6.i_val = local_38.u.i_val * local_48.u.i_val;
    break;
  case N_DIV:
  case N_MOD:
    uVar2 = eval_binop_operands(c2m_ctx,tree,&local_48,&local_38);
    uVar3 = (ulong)uVar2;
    bVar7 = local_38.u.i_val == 0;
    if (uVar2 == 0) {
      if (local_38.u.i_val == 0) goto LAB_001958a7;
      aVar6.i_val = local_48.u.i_val % local_38.u.i_val;
      if (tree->code == N_DIV) {
        aVar6.i_val = local_48.u.i_val / local_38.u.i_val;
      }
      bVar7 = false;
    }
    else if (local_38.u.i_val == 0) {
LAB_001958a7:
      aVar6.i_val = 1;
    }
    else {
      bVar7 = false;
      aVar6.u_val = local_48.u.u_val % local_38.u.u_val;
      if (tree->code == N_DIV) {
        aVar6.u_val = local_48.u.u_val / local_38.u.u_val;
      }
    }
    if (bVar7) {
      pVar9 = get_node_pos(c2m_ctx,tree);
      pcVar5 = "%";
      if (tree->code == N_DIV) {
        pcVar5 = "/";
      }
      error(c2m_ctx,0x1c3253,pVar9.fname,pVar9._8_8_,pcVar5);
    }
    break;
  case N_COND:
    vVar8 = eval(c2m_ctx,(tree->u).ops.head);
    local_48.u = vVar8.u;
    local_48.uns_p = vVar8.uns_p;
    pnVar4 = (tree->u).ops.head;
    if (pnVar4 != (node_t)0x0) {
      uVar2 = (uint)(local_48.u.i_val == 0);
      do {
        pnVar4 = (pnVar4->op_link).next;
        bVar7 = uVar2 != 0;
        uVar2 = uVar2 - 1;
        if (pnVar4 == (node_t)0x0) break;
      } while (bVar7);
    }
    vVar8 = eval(c2m_ctx,pnVar4);
    aVar6 = vVar8.u;
    uVar3 = (ulong)(uint)vVar8.uns_p;
  }
  vVar8.u.i_val = aVar6.i_val;
  vVar8._0_8_ = uVar3;
  return vVar8;
}

Assistant:

static struct val eval (c2m_ctx_t c2m_ctx, node_t tree) {
  int cond;
  struct val res, v1, v2;

#define UNOP(op)                                \
  do {                                          \
    v1 = eval (c2m_ctx, NL_HEAD (tree->u.ops)); \
    res = v1;                                   \
    if (res.uns_p)                              \
      res.u.u_val = op res.u.u_val;             \
    else                                        \
      res.u.i_val = op res.u.i_val;             \
  } while (0)

#define BINOP(op)                                              \
  do {                                                         \
    res.uns_p = eval_binop_operands (c2m_ctx, tree, &v1, &v2); \
    if (res.uns_p)                                             \
      res.u.u_val = v1.u.u_val op v2.u.u_val;                  \
    else                                                       \
      res.u.i_val = v1.u.i_val op v2.u.i_val;                  \
  } while (0)

  switch (tree->code) {
  case N_IGNORE:
    error (c2m_ctx, POS (tree), "wrong preprocessor expression");
    res.uns_p = FALSE;
    res.u.i_val = 0;
    break;
  case N_CH:
    res.uns_p = !char_is_signed_p () || MIR_CHAR_MAX > MIR_INT_MAX;
    if (res.uns_p)
      res.u.u_val = tree->u.ch;
    else
      res.u.i_val = tree->u.ch;
    break;
  case N_CH16:
  case N_CH32:
    res.uns_p = TRUE;
    res.u.u_val = tree->u.ul;
    break;
  case N_I:
  case N_L:
    res.uns_p = FALSE;
    res.u.i_val = tree->u.l;
    break;
  case N_LL:
    res.uns_p = FALSE;
    res.u.i_val = tree->u.ll;
    break;
  case N_U:
  case N_UL:
    res.uns_p = TRUE;
    res.u.u_val = tree->u.ul;
    break;
  case N_ULL:
    res.uns_p = TRUE;
    res.u.u_val = tree->u.ull;
    break;
  case N_BITWISE_NOT: UNOP (~); break;
  case N_NOT: UNOP (!); break;
  case N_EQ: BINOP (==); break;
  case N_NE: BINOP (!=); break;
  case N_LT: BINOP (<); break;
  case N_LE: BINOP (<=); break;
  case N_GT: BINOP (>); break;
  case N_GE: BINOP (>=); break;
  case N_ADD:
    if (NL_EL (tree->u.ops, 1) == NULL) {
      UNOP (+);
    } else {
      BINOP (+);
    }
    break;
  case N_SUB:
    if (NL_EL (tree->u.ops, 1) == NULL) {
      UNOP (-);
    } else {
      BINOP (-);
    }
    break;
  case N_AND: BINOP (&); break;
  case N_OR: BINOP (|); break;
  case N_XOR: BINOP (^); break;
  case N_LSH: BINOP (<<); break;
  case N_RSH: BINOP (>>); break;
  case N_MUL: BINOP (*); break;
  case N_DIV:
  case N_MOD: {
    int zero_p;

    res.uns_p = eval_binop_operands (c2m_ctx, tree, &v1, &v2);
    if (res.uns_p) {
      res.u.u_val = ((zero_p = v2.u.u_val == 0) ? 1
                     : tree->code == N_DIV      ? v1.u.u_val / v2.u.u_val
                                                : v1.u.u_val % v2.u.u_val);
    } else {
      res.u.i_val = ((zero_p = v2.u.i_val == 0) ? 1
                     : tree->code == N_DIV      ? v1.u.i_val / v2.u.i_val
                                                : v1.u.i_val % v2.u.i_val);
    }
    if (zero_p)
      error (c2m_ctx, POS (tree), "division (%s) by zero in preporocessor",
             tree->code == N_DIV ? "/" : "%");
    break;
  }
  case N_ANDAND:
  case N_OROR:
    v1 = eval (c2m_ctx, NL_HEAD (tree->u.ops));
    cond = v1.uns_p ? v1.u.u_val != 0 : v1.u.i_val != 0;
    if (tree->code == N_ANDAND ? cond : !cond) {
      v2 = eval (c2m_ctx, NL_EL (tree->u.ops, 1));
      cond = v2.uns_p ? v2.u.u_val != 0 : v2.u.i_val != 0;
    }
    res.uns_p = FALSE;
    res.u.i_val = cond;
    break;
  case N_COND:
    v1 = eval (c2m_ctx, NL_HEAD (tree->u.ops));
    cond = v1.uns_p ? v1.u.u_val != 0 : v1.u.i_val != 0;
    res = eval (c2m_ctx, NL_EL (tree->u.ops, cond ? 1 : 2));
    break;
  default:
    res.uns_p = FALSE;
    res.u.i_val = 0;
    assert (FALSE);
  }
  return res;
}